

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O2

void __thiscall
fizplex::LPTestFeasibility_IsFeasibleForFreeVarAndRangeRow_Test::TestBody
          (LPTestFeasibility_IsFeasibleForFreeVarAndRangeRow_Test *this)

{
  LP *this_00;
  long lVar1;
  initializer_list<double> l;
  initializer_list<double> l_00;
  initializer_list<double> l_01;
  initializer_list<fizplex::DVector> __l;
  initializer_list<double> l_02;
  initializer_list<double> l_03;
  initializer_list<fizplex::DVector> __l_00;
  allocator_type local_a9;
  vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> local_a8;
  DVector local_90;
  DVector local_78;
  DVector local_60;
  double local_48 [3];
  undefined1 *puStack_30;
  double local_28 [2];
  
  this_00 = &(this->super_LPTestFeasibility).lp;
  LP::add_column(this_00,Free,-INFINITY,INFINITY,0.0);
  LP::add_row(this_00,Range,-5.0,5.0);
  LP::add_value(this_00,0,0,1.0);
  LP::add_logicals(this_00);
  local_28[0] = 0.0;
  local_28[1] = 5.0;
  l._M_len = 2;
  l._M_array = local_28;
  DVector::DVector(&local_90,l);
  local_48[2] = -5.0;
  puStack_30 = (undefined1 *)0x4024000000000000;
  l_00._M_len = 2;
  l_00._M_array = local_48 + 2;
  DVector::DVector(&local_78,l_00);
  local_48[0] = 5.0;
  local_48[1] = 0.0;
  l_01._M_len = 2;
  l_01._M_array = local_48;
  DVector::DVector(&local_60,l_01);
  __l._M_len = 3;
  __l._M_array = &local_90;
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::vector(&local_a8,__l,&local_a9);
  LPTestFeasibility::check_feasible(&this->super_LPTestFeasibility,true,&local_a8);
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::~vector(&local_a8);
  lVar1 = 0x30;
  do {
    std::valarray<double>::~valarray((valarray<double> *)((long)&local_90.vals._M_size + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  local_28[0] = -6.0;
  local_28[1] = 1.0;
  l_02._M_len = 2;
  l_02._M_array = local_28;
  DVector::DVector(&local_90,l_02);
  local_48[2] = 6.0;
  puStack_30 = &DAT_bff0000000000000;
  l_03._M_len = 2;
  l_03._M_array = local_48 + 2;
  DVector::DVector(&local_78,l_03);
  __l_00._M_len = 2;
  __l_00._M_array = &local_90;
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::vector
            (&local_a8,__l_00,(allocator_type *)local_48);
  LPTestFeasibility::check_feasible(&this->super_LPTestFeasibility,false,&local_a8);
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::~vector(&local_a8);
  lVar1 = 0x18;
  do {
    std::valarray<double>::~valarray((valarray<double> *)((long)&local_90.vals._M_size + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

TEST_F(LPTestFeasibility, IsFeasibleForFreeVarAndRangeRow) {
  lp.add_column(ColType::Free, -inf, inf);
  lp.add_row(RowType::Range, -5, 5);
  lp.add_value(0, 0, 1.0);
  lp.add_logicals();

  check_feasible(true, {{0, 5}, {-5, 10}, {5, 0}});
  check_feasible(false, {{-6, 1}, {6, -1}});
}